

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionChecker.cpp
# Opt level: O0

void __thiscall RegionChecker::add(RegionChecker *this,size_t from,size_t to)

{
  ostream *poVar1;
  vector<bool,_std::allocator<bool>_> *in_RDX;
  vector<bool,_std::allocator<bool>_> *in_RSI;
  size_t i;
  reference local_30;
  vector<bool,_std::allocator<bool>_> *local_20;
  
  for (local_20 = in_RSI; local_20 < in_RDX;
      local_20 = (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(local_20->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1)) {
    local_30 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RSI,(size_type)in_RDX);
    std::_Bit_reference::operator=(&local_30,true);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Added region [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ulong)in_RSI);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ulong)in_RDX);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void RegionChecker::add(size_t from, size_t to) {
	for (size_t i = from; i < to; i++) {
		usedBits[i] = true;
	}

	std::cout << "Added region [" << from << ", " << to << ")" << std::endl;
}